

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O3

void __thiscall AixLog::Log::add_logsink(Log *this,log_sink_ptr *sink)

{
  recursive_mutex *__mutex;
  undefined8 uVar1;
  int iVar2;
  
  __mutex = &this->mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
    push_back(&this->log_sinks_,sink);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void add_logsink(const log_sink_ptr& sink) {
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    log_sinks_.push_back(sink);
  }